

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

char * deqp::gls::getFloatFractionUniformName(int number)

{
  char *pcStack_10;
  int number_local;
  
  switch(number) {
  case 1:
    pcStack_10 = "uf_one";
    break;
  case 2:
    pcStack_10 = "uf_half";
    break;
  case 3:
    pcStack_10 = "uf_third";
    break;
  case 4:
    pcStack_10 = "uf_fourth";
    break;
  case 5:
    pcStack_10 = "uf_fifth";
    break;
  case 6:
    pcStack_10 = "uf_sixth";
    break;
  case 7:
    pcStack_10 = "uf_seventh";
    break;
  case 8:
    pcStack_10 = "uf_eighth";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* getFloatFractionUniformName (int number)
{
	switch (number)
	{
		case 1: return "uf_one";
		case 2: return "uf_half";
		case 3: return "uf_third";
		case 4: return "uf_fourth";
		case 5: return "uf_fifth";
		case 6: return "uf_sixth";
		case 7: return "uf_seventh";
		case 8: return "uf_eighth";
		default:
			DE_ASSERT(false);
			return "";
	}
}